

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall TimerTest_detached_Test::~TimerTest_detached_Test(TimerTest_detached_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TimerTest, detached) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	{
		timer timer_obj{ period, [&iterations, &promise](timer& in_timer) {
			if (++iterations == total_iterations) {
				EXPECT_FALSE(in_timer.null());
				in_timer.cancel();
				promise.set_value();
			}
		} };

		EXPECT_FALSE(timer_obj.null());
		timer_obj.detach();
		EXPECT_FALSE(timer_obj.null());
	}

	EXPECT_EQ(promise.get_future().wait_for(timeout), std::future_status::ready);
}